

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sink-inl.h
# Opt level: O0

level_enum __thiscall spdlog::sinks::sink::level(sink *this)

{
  long in_RDI;
  memory_order __b;
  
  std::operator&(memory_order_relaxed,__memory_order_mask);
  return *(level_enum *)(in_RDI + 8);
}

Assistant:

SPDLOG_INLINE spdlog::level::level_enum spdlog::sinks::sink::level() const
{
    return static_cast<spdlog::level::level_enum>(level_.load(std::memory_order_relaxed));
}